

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O2

mz_bool mz_zip_writer_finalize_archive(mz_zip_archive *pZip)

{
  mz_zip_internal_state *pmVar1;
  mz_bool mVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  undefined2 uVar6;
  undefined4 uVar7;
  mz_uint64 mVar8;
  mz_uint8 hdr [22];
  undefined8 local_38;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  undefined1 uStack_28;
  undefined1 uStack_27;
  undefined1 uStack_26;
  undefined1 uStack_25;
  undefined2 uStack_24;
  
  mVar2 = 0;
  if (pZip != (mz_zip_archive *)0x0) {
    pmVar1 = pZip->m_pState;
    if (((pmVar1 != (mz_zip_internal_state *)0x0) && (pZip->m_zip_mode == MZ_ZIP_MODE_WRITING)) &&
       (mVar2 = 0, pZip->m_total_files < 0x10000)) {
      mVar8 = pZip->m_archive_size;
      sVar5 = (pmVar1->m_central_dir).m_size;
      if (0xfffffffeffffffff < (mVar8 + sVar5) - 0xffffffea) {
        if (pZip->m_total_files == 0) {
          uVar6 = 0;
          uVar7 = 0;
          sVar5 = 0;
        }
        else {
          pZip->m_central_directory_file_ofs = mVar8;
          sVar4 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar8,(pmVar1->m_central_dir).m_p,sVar5);
          if (sVar4 != sVar5) {
            return 0;
          }
          uVar7 = (undefined4)mVar8;
          mVar8 = pZip->m_archive_size + sVar5;
          pZip->m_archive_size = mVar8;
          uVar6 = (undefined2)pZip->m_total_files;
        }
        uStack_24 = 0;
        local_38 = 0x6054b50;
        uStack_30 = (undefined1)uVar6;
        uStack_2f = (undefined1)((ushort)uVar6 >> 8);
        uStack_2c = (undefined1)sVar5;
        uStack_2b = (undefined1)(sVar5 >> 8);
        uStack_2a = (undefined1)(sVar5 >> 0x10);
        uStack_29 = (undefined1)(sVar5 >> 0x18);
        uStack_28 = (undefined1)uVar7;
        uStack_27 = (undefined1)((uint)uVar7 >> 8);
        uStack_26 = (undefined1)((uint)uVar7 >> 0x10);
        uStack_25 = (undefined1)((uint)uVar7 >> 0x18);
        uStack_2e = uStack_30;
        uStack_2d = uStack_2f;
        sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar8,&local_38,0x16);
        if (sVar5 == 0x16) {
          if (((FILE *)pmVar1->m_pFile != (FILE *)0x0) &&
             (iVar3 = fflush((FILE *)pmVar1->m_pFile), iVar3 == -1)) {
            return 0;
          }
          pZip->m_archive_size = pZip->m_archive_size + 0x16;
          pZip->m_zip_mode = MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED;
          mVar2 = 1;
        }
        else {
          mVar2 = 0;
        }
      }
    }
  }
  return mVar2;
}

Assistant:

mz_bool mz_zip_writer_finalize_archive(mz_zip_archive* pZip) {
  mz_zip_internal_state* pState;
  mz_uint64 central_dir_ofs, central_dir_size;
  mz_uint8 hdr[MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE];

  if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING))
    return MZ_FALSE;

  pState = pZip->m_pState;

  // no zip64 support yet
  if ((pZip->m_total_files > 0xFFFF) || ((pZip->m_archive_size + pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) > 0xFFFFFFFF))
    return MZ_FALSE;

  central_dir_ofs = 0;
  central_dir_size = 0;
  if (pZip->m_total_files) {
    // Write central directory
    central_dir_ofs = pZip->m_archive_size;
    central_dir_size = pState->m_central_dir.m_size;
    pZip->m_central_directory_file_ofs = central_dir_ofs;
    if (pZip->m_pWrite(pZip->m_pIO_opaque, central_dir_ofs, pState->m_central_dir.m_p, (size_t)central_dir_size) != central_dir_size)
      return MZ_FALSE;
    pZip->m_archive_size += central_dir_size;
  }

  // Write end of central directory record
  MZ_CLEAR_OBJ(hdr);
  MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_SIG_OFS, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG);
  MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS, pZip->m_total_files);
  MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS, pZip->m_total_files);
  MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_SIZE_OFS, central_dir_size);
  MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_OFS_OFS, central_dir_ofs);

  if (pZip->m_pWrite(pZip->m_pIO_opaque, pZip->m_archive_size, hdr, sizeof(hdr)) != sizeof(hdr))
    return MZ_FALSE;
#ifndef MINIZ_NO_STDIO
  if ((pState->m_pFile) && (MZ_FFLUSH(pState->m_pFile) == EOF))
    return MZ_FALSE;
#endif  // #ifndef MINIZ_NO_STDIO

  pZip->m_archive_size += sizeof(hdr);

  pZip->m_zip_mode = MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED;
  return MZ_TRUE;
}